

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopup(ImGuiID id)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (GImGui->OpenPopupStack).Size;
  iVar2 = (GImGui->CurrentPopupStack).Size;
  if ((iVar2 < iVar1) && ((GImGui->OpenPopupStack).Data[iVar2].PopupId == id)) {
    ClosePopupToLevel(iVar1 + -1);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopup(ImGuiID id)
{
    if (!IsPopupOpen(id))
        return;
    ImGuiContext& g = *GImGui;
    ClosePopupToLevel(g.OpenPopupStack.Size - 1);
}